

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall
duckdb_re2::CharClassBuilder::AddRangeFlags
          (CharClassBuilder *this,Rune lo,Rune hi,ParseFlags parse_flags)

{
  ParseFlags PVar1;
  ParseFlags in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  bool cutnl;
  Rune in_stack_000000f0;
  Rune in_stack_000000f4;
  CharClassBuilder *in_stack_000000f8;
  int in_stack_00000184;
  Rune in_stack_00000188;
  Rune in_stack_0000018c;
  CharClassBuilder *in_stack_00000190;
  ParseFlags parse_flags_00;
  undefined2 in_stack_ffffffffffffffe8;
  char cVar3;
  uint uVar2;
  Rune hi_00;
  
  parse_flags_00 = (ParseFlags)((ulong)in_RDI >> 0x20);
  PVar1 = operator&(in_ECX,ClassNL);
  uVar2 = (uint)CONCAT12(1,in_stack_ffffffffffffffe8);
  if (PVar1 != NoParseFlags) {
    PVar1 = operator&(in_ECX,NeverNL);
    uVar2 = (uint)CONCAT12(PVar1 != NoParseFlags,(short)uVar2);
  }
  cVar3 = (char)(uVar2 >> 0x10);
  hi_00 = CONCAT13(cVar3,(int3)uVar2);
  if (((cVar3 == '\0') || (10 < in_ESI)) || (in_EDX < 10)) {
    PVar1 = operator&(in_ECX,FoldCase);
    if (PVar1 == NoParseFlags) {
      AddRange(in_stack_000000f8,in_stack_000000f4,in_stack_000000f0);
    }
    else {
      AddFoldedRange(in_stack_00000190,in_stack_0000018c,in_stack_00000188,in_stack_00000184);
    }
  }
  else {
    if (in_ESI < 10) {
      AddRangeFlags((CharClassBuilder *)CONCAT44(in_ESI,in_EDX),in_ECX,hi_00,parse_flags_00);
    }
    if (10 < in_EDX) {
      AddRangeFlags((CharClassBuilder *)CONCAT44(in_ESI,in_EDX),in_ECX,hi_00,parse_flags_00);
    }
  }
  return;
}

Assistant:

void CharClassBuilder::AddRangeFlags(
    Rune lo, Rune hi, Regexp::ParseFlags parse_flags) {

  // Take out \n if the flags say so.
  bool cutnl = !(parse_flags & Regexp::ClassNL) ||
               (parse_flags & Regexp::NeverNL);
  if (cutnl && lo <= '\n' && '\n' <= hi) {
    if (lo < '\n')
      AddRangeFlags(lo, '\n' - 1, parse_flags);
    if (hi > '\n')
      AddRangeFlags('\n' + 1, hi, parse_flags);
    return;
  }

  // If folding case, add fold-equivalent characters too.
  if (parse_flags & Regexp::FoldCase)
    AddFoldedRange(this, lo, hi, 0);
  else
    AddRange(lo, hi);
}